

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

int MAFSA_automaton_str_to_int(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  int iVar1;
  int *in_RCX;
  MAFSA_letter in_DL;
  ulong in_RSI;
  long in_RDI;
  int i;
  int local_24;
  
  for (local_24 = 0;
      ((ulong)(long)local_24 < in_RSI && (in_DL != *(MAFSA_letter *)(in_RDI + local_24)));
      local_24 = local_24 + 1) {
  }
  iVar1 = MAFSA_automaton_val_to_int
                    ((MAFSA_letter *)(in_RDI + local_24 + 1),(in_RSI - (long)local_24) - 1,in_DL,
                     in_RCX);
  return iVar1;
}

Assistant:

extern int MAFSA_automaton_str_to_int(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;

    for (i = 0; i < sz_l; ++i)
    {
        if (delim == l[i])
        {
            break;
        }
    }

    return MAFSA_automaton_val_to_int(l + i + 1,
        sz_l - i - 1, delim, out);
}